

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

int parse_der_pubkey(uchar *der,size_t len,mp_int *keyP,mp_int *keyQ,mp_int *keyG,mp_int *keyY)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *local_40;
  mp_int *local_38;
  
  uVar4 = 0;
  uVar5 = 0;
  if ((*der & 0x3f) == 0x30) {
    pbVar7 = der + len;
    local_40 = der + 1;
    local_38 = keyY;
    sVar3 = _parse_length(&local_40);
    pbVar6 = local_40;
    if (der + sVar3 + 1 <= pbVar7) {
      bVar1 = *local_40;
      if ((bVar1 & 0x3f) == 0x30) {
        local_40 = local_40 + 1;
        sVar3 = _parse_length(&local_40);
        if (pbVar7 < pbVar6 + sVar3 + 1) {
          return 0;
        }
        bVar1 = *local_40;
        pbVar6 = local_40;
        if ((bVar1 & 0x3f) == 6) {
          local_40 = local_40 + 1;
          sVar3 = _parse_length(&local_40);
          pbVar6 = local_40;
          if (sVar3 != 7) {
            return 0;
          }
          iVar2 = bcmp(local_40,parse_der_pubkey::ansi_x9_57,7);
          if (iVar2 != 0) {
            return 0;
          }
          bVar1 = pbVar6[7];
          pbVar6 = pbVar6 + 7;
        }
        if ((bVar1 & 0x3f) == 0x30) {
          local_40 = pbVar6 + 1;
          sVar3 = _parse_length(&local_40);
          if (pbVar7 < pbVar6 + sVar3 + 1) {
            return 0;
          }
          bVar1 = *local_40;
          pbVar6 = local_40;
          if ((bVar1 & 0x3f) == 2) {
            local_40 = local_40 + 1;
            sVar3 = _parse_length(&local_40);
            pbVar6 = local_40 + sVar3;
            if (pbVar7 < pbVar6) {
              return 0;
            }
            iVar2 = mp_read_unsigned_bin(keyP,local_40,(int)sVar3);
            if (iVar2 != 0) {
              return 0;
            }
            bVar1 = *pbVar6;
          }
          if ((bVar1 & 0x3f) == 2) {
            local_40 = pbVar6 + 1;
            sVar3 = _parse_length(&local_40);
            pbVar6 = local_40 + sVar3;
            if (pbVar7 < pbVar6) {
              return 0;
            }
            iVar2 = mp_read_unsigned_bin(keyQ,local_40,(int)sVar3);
            if (iVar2 != 0) {
              return 0;
            }
            bVar1 = *pbVar6;
          }
          if ((bVar1 & 0x3f) == 2) {
            local_40 = pbVar6 + 1;
            sVar3 = _parse_length(&local_40);
            pbVar6 = local_40 + sVar3;
            if (pbVar7 < pbVar6) {
              return 0;
            }
            iVar2 = mp_read_unsigned_bin(keyG,local_40,(int)sVar3);
            if (iVar2 != 0) {
              return 0;
            }
            bVar1 = *pbVar6;
          }
        }
      }
      uVar5 = uVar4;
      if ((bVar1 & 0x3f) == 3) {
        local_40 = pbVar6 + 1;
        sVar3 = _parse_length(&local_40);
        if (((pbVar6 + sVar3 + 1 <= pbVar7) && (*local_40 == 0)) && ((local_40[1] & 0x3f) == 2)) {
          local_40 = local_40 + 2;
          sVar3 = _parse_length(&local_40);
          if (local_40 + sVar3 <= pbVar7) {
            iVar2 = mp_read_unsigned_bin(local_38,local_40,(int)sVar3);
            uVar5 = (uint)(iVar2 == 0);
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int parse_der_pubkey(const unsigned char* der, size_t len, mp_int* keyP, mp_int* keyQ, mp_int* keyG, mp_int* keyY)
{
	static unsigned char ansi_x9_57[] = { 0x2A, 0x86, 0x48, 0xCE, 0x38, 0x04, 0x01 };
	const unsigned char* end = der + len;

	SEQUENCE
	{
		if ((++der + _parse_length(&der)) > end)
			return 0;

		SEQUENCE
		{
			if ((++der + _parse_length(&der)) > end)
				return 0;

			OBJECT_IDENTIFIER
			{
				der++;
				size_t length = _parse_length(&der);

				if (length != sizeof(ansi_x9_57) || (length == sizeof(ansi_x9_57) && memcmp(der, ansi_x9_57, length) != 0))
					return 0;

				der += length;
			}

			SEQUENCE
			{
				if ((++der + _parse_length(&der)) > end)
					return 0;

				INTEGER
				{
					// p
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyP, der, length) != MP_OKAY)
						return 0;

					der += length;
				}

				INTEGER
				{
					// q
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyQ, der, length) != MP_OKAY)
						return 0;

					der += length;
				}

				INTEGER
				{
					// g
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyG, der, length) != MP_OKAY)
						return 0;

					der += length;
				}
			}
		}

		BIT_STRING
		{
			if ((++der + _parse_length(&der)) > end)
				return 0;

			if (*der++ != 0)
				return 0;

			INTEGER
			{
				// y
				der++;
				size_t length = _parse_length(&der);

				if ((der + length) > end)
					return 0;

				return (mp_read_unsigned_bin(keyY, der, length) == MP_OKAY);
			}
		}
	}

	return 0;
}